

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sais.c
# Opt level: O1

int sais_int_bwt(int *T,int *U,int *A,int n,int k)

{
  int iVar1;
  uint uVar2;
  ulong uVar3;
  
  uVar2 = 0xffffffff;
  if (0 < k && ((-1 < n && A != (int *)0x0) && (U != (int *)0x0 && T != (int *)0x0))) {
    if (n < 2) {
      uVar2 = n;
      if (n == 1) {
        *U = *T;
      }
    }
    else {
      uVar3 = 0;
      uVar2 = sais_main(T,A,(int *)0x0,0,n,k,4,1,1);
      if (-1 < (int)uVar2) {
        *U = T[(ulong)(uint)n - 1];
        if (uVar2 != 0) {
          uVar3 = 0;
          do {
            U[uVar3 + 1] = A[uVar3];
            uVar3 = uVar3 + 1;
          } while (uVar2 != uVar3);
        }
        if ((int)uVar3 + 1 < n) {
          uVar3 = uVar3 & 0xffffffff;
          do {
            U[uVar3 + 1] = A[uVar3 + 1];
            iVar1 = (int)uVar3;
            uVar3 = uVar3 + 1;
          } while (iVar1 + 2 < n);
        }
        uVar2 = uVar2 + 1;
      }
    }
  }
  return uVar2;
}

Assistant:

int
sais_int_bwt(const int *T, int *U, int *A, int n, int k) {
  int i, pidx;
  if((T == NULL) || (U == NULL) || (A == NULL) || (n < 0) || (k <= 0)) { return -1; }
  if(n <= 1) { if(n == 1) { U[0] = T[0]; } return n; }
  pidx = sais_main(T, A, NULL, 0, n, k, sizeof(int), 1,1);
  if(pidx < 0) { return pidx; }
  U[0] = T[n - 1];
  for(i = 0; i < pidx; ++i) { U[i + 1] = A[i]; }
  for(i += 1; i < n; ++i) { U[i] = A[i]; }
  pidx += 1;
  return pidx;
}